

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

unsigned_long PaUtil_CopyInput(PaUtilBufferProcessor *bp,void **buffer,unsigned_long frameCount)

{
  uint uVar1;
  uint uVar2;
  PaUtilChannelDescriptor *pPVar3;
  void *pvVar4;
  void *pvVar5;
  uint uVar6;
  ulong local_58;
  uint local_4c;
  uint i;
  uint destChannelStrideBytes;
  uint destSampleStrideSamples;
  void **nonInterleavedDestPtrs;
  uchar *destBytePtr;
  uint framesToCopy;
  PaUtilChannelDescriptor *hostInputChannels;
  unsigned_long frameCount_local;
  void **buffer_local;
  PaUtilBufferProcessor *bp_local;
  
  pPVar3 = bp->hostInputChannels[0];
  local_58 = frameCount;
  if (bp->hostInputFrameCount[0] < frameCount) {
    local_58 = bp->hostInputFrameCount[0];
  }
  uVar6 = (uint)local_58;
  if (bp->userInputIsInterleaved == 0) {
    pvVar4 = *buffer;
    for (local_4c = 0; local_4c < bp->inputChannelCount; local_4c = local_4c + 1) {
      pvVar5 = *(void **)((long)pvVar4 + (ulong)local_4c * 8);
      (*bp->inputConverter)
                (pvVar5,1,pPVar3[local_4c].data,pPVar3[local_4c].stride,uVar6,&bp->ditherGenerator);
      *(ulong *)((long)pvVar4 + (ulong)local_4c * 8) =
           (long)pvVar5 + (ulong)(bp->bytesPerUserInputSample * uVar6);
      pPVar3[local_4c].data =
           (void *)((long)pPVar3[local_4c].data +
                   (ulong)(uVar6 * pPVar3[local_4c].stride * bp->bytesPerHostInputSample));
    }
  }
  else {
    nonInterleavedDestPtrs = (void **)*buffer;
    uVar1 = bp->inputChannelCount;
    uVar2 = bp->bytesPerUserInputSample;
    for (local_4c = 0; local_4c < bp->inputChannelCount; local_4c = local_4c + 1) {
      (*bp->inputConverter)
                (nonInterleavedDestPtrs,uVar1,pPVar3[local_4c].data,pPVar3[local_4c].stride,uVar6,
                 &bp->ditherGenerator);
      nonInterleavedDestPtrs = (void **)((long)nonInterleavedDestPtrs + (ulong)uVar2);
      pPVar3[local_4c].data =
           (void *)((long)pPVar3[local_4c].data +
                   (ulong)(uVar6 * pPVar3[local_4c].stride * bp->bytesPerHostInputSample));
    }
    *buffer = (void *)((long)*buffer +
                      (ulong)(uVar6 * bp->inputChannelCount * bp->bytesPerUserInputSample));
  }
  bp->hostInputFrameCount[0] = bp->hostInputFrameCount[0] - (local_58 & 0xffffffff);
  return local_58 & 0xffffffff;
}

Assistant:

unsigned long PaUtil_CopyInput( PaUtilBufferProcessor* bp,
        void **buffer, unsigned long frameCount )
{
    PaUtilChannelDescriptor *hostInputChannels;
    unsigned int framesToCopy;
    unsigned char *destBytePtr;
    void **nonInterleavedDestPtrs;
    unsigned int destSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int destChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i;

    hostInputChannels = bp->hostInputChannels[0];
    framesToCopy = PA_MIN_( bp->hostInputFrameCount[0], frameCount );

    if( bp->userInputIsInterleaved )
    {
        destBytePtr = (unsigned char*)*buffer;
        
        destSampleStrideSamples = bp->inputChannelCount;
        destChannelStrideBytes = bp->bytesPerUserInputSample;

        for( i=0; i<bp->inputChannelCount; ++i )
        {
            bp->inputConverter( destBytePtr, destSampleStrideSamples,
                                hostInputChannels[i].data,
                                hostInputChannels[i].stride,
                                framesToCopy, &bp->ditherGenerator );

            destBytePtr += destChannelStrideBytes;  /* skip to next dest channel */

            /* advance source ptr for next iteration */
            hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                    framesToCopy * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
        }

        /* advance callers dest pointer (buffer) */
        *buffer = ((unsigned char *)*buffer) +
                framesToCopy * bp->inputChannelCount * bp->bytesPerUserInputSample;
    }
    else
    {
        /* user input is not interleaved */
        
        nonInterleavedDestPtrs = (void**)*buffer;

        destSampleStrideSamples = 1;
        
        for( i=0; i<bp->inputChannelCount; ++i )
        {
            destBytePtr = (unsigned char*)nonInterleavedDestPtrs[i];

            bp->inputConverter( destBytePtr, destSampleStrideSamples,
                                hostInputChannels[i].data,
                                hostInputChannels[i].stride,
                                framesToCopy, &bp->ditherGenerator );

            /* advance callers dest pointer (nonInterleavedDestPtrs[i]) */
            destBytePtr += bp->bytesPerUserInputSample * framesToCopy;
            nonInterleavedDestPtrs[i] = destBytePtr;
            
            /* advance source ptr for next iteration */
            hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                    framesToCopy * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
        }
    }

    bp->hostInputFrameCount[0] -= framesToCopy;
    
    return framesToCopy;
}